

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O2

void __thiscall sf2cute::RIFFChunk::~RIFFChunk(RIFFChunk *this)

{
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface = (_func_int **)&PTR__RIFFChunk_0011d9c0
  ;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->data_).super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~RIFFChunk() = default;